

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# str-util.cc
# Opt level: O1

string * tinyusdz::buildEscapedAndQuotedStringForUSDA(string *__return_storage_ptr__,string *str)

{
  char cVar1;
  ulong uVar2;
  long *plVar3;
  char *pcVar4;
  long *plVar5;
  ulong uVar6;
  ulong uVar7;
  bool bVar8;
  bool bVar9;
  bool bVar10;
  string delim;
  string local_b0;
  long *local_90;
  char *local_88;
  long local_80 [2];
  long *local_70;
  long local_68;
  long local_60;
  long lStack_58;
  string local_50;
  
  uVar2 = str->_M_string_length;
  bVar9 = uVar2 != 0;
  bVar8 = bVar9;
  if (bVar9) {
    bVar8 = true;
    uVar7 = 1;
    do {
      cVar1 = (str->_M_dataplus)._M_p[uVar7 - 1];
      if ((cVar1 == '\n') || (cVar1 == '\r')) break;
      bVar8 = uVar7 < uVar2;
      bVar10 = uVar7 != uVar2;
      uVar7 = uVar7 + 1;
    } while (bVar10);
  }
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  if (bVar8) {
    bVar8 = hasTripleQuotes(str,false);
    bVar9 = hasTripleQuotes(str,true);
    local_90 = local_80;
    ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,"\"\"\"","");
    if (bVar8 && bVar9) goto LAB_00299825;
    if (!bVar8) {
      if (bVar9) {
        pcVar4 = "\'\'\'";
LAB_00299890:
        ::std::__cxx11::string::_M_replace((ulong)&local_90,0,local_88,(ulong)pcVar4);
      }
      goto LAB_00299897;
    }
LAB_0029983c:
    bVar8 = false;
  }
  else {
    bVar8 = bVar9;
    if (uVar2 != 0) {
      pcVar4 = (str->_M_dataplus)._M_p;
      bVar8 = true;
      if (*pcVar4 != '\'') {
        uVar7 = 1;
        do {
          uVar6 = uVar7;
          if (uVar2 == uVar6) break;
          uVar7 = uVar6 + 1;
        } while (pcVar4[uVar6] != '\'');
        bVar8 = uVar6 < uVar2;
      }
    }
    if (uVar2 != 0) {
      pcVar4 = (str->_M_dataplus)._M_p;
      bVar9 = true;
      if (*pcVar4 != '\"') {
        uVar7 = 1;
        do {
          uVar6 = uVar7;
          if (uVar2 == uVar6) break;
          uVar7 = uVar6 + 1;
        } while (pcVar4[uVar6] != '\"');
        bVar9 = uVar6 < uVar2;
      }
    }
    local_90 = local_80;
    ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,"\"","");
    if (!(bool)(bVar8 & bVar9)) {
      if (bVar8) goto LAB_0029983c;
      if (bVar9) {
        pcVar4 = "\'";
        goto LAB_00299890;
      }
LAB_00299897:
      ::std::__cxx11::string::_M_assign((string *)__return_storage_ptr__);
      goto LAB_002998a2;
    }
LAB_00299825:
    bVar8 = true;
  }
  escapeSingleQuote(&local_b0,str,bVar8);
  ::std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_b0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
    operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
  }
LAB_002998a2:
  escapeControlSequence(&local_50,__return_storage_ptr__);
  local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
  ::std::__cxx11::string::_M_construct<char*>
            ((string *)&local_b0,local_90,local_88 + (long)local_90);
  ::std::__cxx11::string::_M_append((char *)&local_b0,(ulong)local_50._M_dataplus._M_p);
  plVar3 = (long *)::std::__cxx11::string::_M_append((char *)&local_b0,(ulong)local_90);
  plVar5 = plVar3 + 2;
  if ((long *)*plVar3 == plVar5) {
    local_60 = *plVar5;
    lStack_58 = plVar3[3];
    local_70 = &local_60;
  }
  else {
    local_60 = *plVar5;
    local_70 = (long *)*plVar3;
  }
  local_68 = plVar3[1];
  *plVar3 = (long)plVar5;
  plVar3[1] = 0;
  *(undefined1 *)(plVar3 + 2) = 0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
    operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
  }
  ::std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_70);
  if (local_70 != &local_60) {
    operator_delete(local_70,local_60 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  if (local_90 != local_80) {
    operator_delete(local_90,local_80[0] + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string buildEscapedAndQuotedStringForUSDA(const std::string &str) {
  // Rule for triple quote string:
  //
  // if str contains newline
  //   if str contains """ and '''
  //      use quote """ and escape " to \\", no escape for '''
  //   elif str contains """ only
  //      use quote ''' and no escape for """
  //   elif str contains ''' only
  //      use quote """ and no escape for '''
  //   else
  //      use quote """
  //
  // Rule for single quote string
  //   if str contains " and '
  //      use quote " and escape " to \\", no escape for '
  //   elif str contains " only
  //      use quote ' and no escape for "
  //   elif str contains ' only
  //      use quote " and no escape for '
  //   else
  //      use quote "

  bool has_newline = hasNewline(str);

  std::string s;

  if (has_newline) {
    bool has_triple_single_quoted_string = hasTripleQuotes(str, false);
    bool has_triple_double_quoted_string = hasTripleQuotes(str, true);

    std::string delim = "\"\"\"";
    if (has_triple_single_quoted_string && has_triple_double_quoted_string) {
      s = escapeSingleQuote(str, true);
    } else if (has_triple_single_quoted_string) {
      s = escapeSingleQuote(str, false);
    } else if (has_triple_double_quoted_string) {
      delim = "'''";
      s = str;
    } else {
      s = str;
    }

    s = quote(escapeControlSequence(s), delim);

  } else {
    // single quote string.
    bool has_single_quote = hasQuotes(str, false);
    bool has_double_quote = hasQuotes(str, true);

    std::string delim = "\"";
    if (has_single_quote && has_double_quote) {
      s = escapeSingleQuote(str, true);
    } else if (has_single_quote) {
      s = escapeSingleQuote(str, false);
    } else if (has_double_quote) {
      delim = "'";
      s = str;
    } else {
      s = str;
    }

    s = quote(escapeControlSequence(s), delim);
  }

  return s;
}